

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

string * bytesToHexString_abi_cxx11_(string *__return_storage_ptr__,uint8_t *str,uint64_t s)

{
  long lVar1;
  ostream *this;
  size_t i;
  uint64_t uVar2;
  ostringstream ret;
  uint auStack_190 [88];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ret);
  for (uVar2 = 0; s != uVar2; uVar2 = uVar2 + 1) {
    *(uint *)((long)auStack_190 + *(long *)(_ret + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(_ret + -0x18)) & 0xffffffb5 | 8;
    this = std::operator<<(&ret,0x30);
    lVar1 = *(long *)this;
    *(undefined8 *)(this + *(long *)(lVar1 + -0x18) + 0x10) = 2;
    *(uint *)(this + *(long *)(lVar1 + -0x18) + 0x18) =
         *(uint *)(this + *(long *)(lVar1 + -0x18) + 0x18) & 0xffffbfff;
    std::ostream::operator<<((ostream *)this,(uint)str[uVar2]);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ret);
  return __return_storage_ptr__;
}

Assistant:

std::string bytesToHexString(const uint8_t *str, const uint64_t s)
{
	std::ostringstream ret;

	for (size_t i = 0; i < s; ++i)
		ret << std::hex << std::setfill('0') << std::setw(2) << std::nouppercase << (int) str[i];

	return ret.str();
}